

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O1

void mzd_mul_v_parity_uint64_256_30(mzd_local_t *c,mzd_local_t *v,mzd_local_t *At)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  byte bVar5;
  bool bVar6;
  ulong uVar7;
  long lVar8;
  long unaff_R13;
  long unaff_R14;
  undefined1 auVar9 [32];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = v->w64[0];
  auVar10 = vpbroadcastq_avx512f(auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = v->w64[1];
  auVar11 = vpbroadcastq_avx512f(auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = v->w64[2];
  auVar12 = vpbroadcastq_avx512f(auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = v->w64[3];
  auVar13 = vpbroadcastq_avx512f(auVar4);
  auVar26 = ZEXT1664((undefined1  [16])0x0);
  auVar14 = vpmovsxbq_avx512f(ZEXT816(0x1718191a1b1c1d1e));
  lVar8 = 0;
  auVar15 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar16 = vpbroadcastq_avx512f(ZEXT816(0x1e));
  auVar17 = vpbroadcastq_avx512f();
  auVar18 = vpbroadcastq_avx512f(ZEXT816(1));
  auVar19 = vpbroadcastq_avx512f(ZEXT816(0x40));
  auVar20 = vpbroadcastq_avx512f(ZEXT816(0xfffffffffffffff8));
  do {
    auVar21 = vmovdqa64_avx512f(auVar26);
    auVar26 = vpbroadcastq_avx512f();
    auVar22 = vporq_avx512f(auVar26,auVar15);
    uVar7 = vpcmpuq_avx512f(auVar22,auVar16,1);
    auVar26 = vpsubq_avx512f(auVar16,auVar14);
    auVar26 = vpsllq_avx512f(auVar26,5);
    vpaddq_avx512f(auVar17,auVar26);
    auVar23 = vpgatherqq_avx512f(*(undefined8 *)((long)At->w64 + unaff_R13));
    bVar5 = (byte)uVar7;
    auVar26._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * auVar23._8_8_;
    auVar26._0_8_ = (ulong)(bVar5 & 1) * auVar23._0_8_;
    auVar26._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * auVar23._16_8_;
    auVar26._24_8_ = (ulong)((byte)(uVar7 >> 3) & 1) * auVar23._24_8_;
    auVar26._32_8_ = (ulong)((byte)(uVar7 >> 4) & 1) * auVar23._32_8_;
    auVar26._40_8_ = (ulong)((byte)(uVar7 >> 5) & 1) * auVar23._40_8_;
    auVar26._48_8_ = (ulong)((byte)(uVar7 >> 6) & 1) * auVar23._48_8_;
    auVar26._56_8_ = (uVar7 >> 7) * auVar23._56_8_;
    auVar23 = vpgatherqq_avx512f(*(undefined8 *)(unaff_R14 + 8));
    auVar25._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * auVar23._8_8_;
    auVar25._0_8_ = (ulong)(bVar5 & 1) * auVar23._0_8_;
    auVar25._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * auVar23._16_8_;
    auVar25._24_8_ = (ulong)((byte)(uVar7 >> 3) & 1) * auVar23._24_8_;
    auVar25._32_8_ = (ulong)((byte)(uVar7 >> 4) & 1) * auVar23._32_8_;
    auVar25._40_8_ = (ulong)((byte)(uVar7 >> 5) & 1) * auVar23._40_8_;
    auVar25._48_8_ = (ulong)((byte)(uVar7 >> 6) & 1) * auVar23._48_8_;
    auVar25._56_8_ = (uVar7 >> 7) * auVar23._56_8_;
    auVar23 = vpandq_avx512f(auVar25,auVar11);
    auVar26 = vpternlogq_avx512f(auVar23,auVar26,auVar10,0x78);
    auVar23 = vpgatherqq_avx512f(*(undefined8 *)(unaff_R14 + 0x10));
    auVar24._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * auVar23._8_8_;
    auVar24._0_8_ = (ulong)(bVar5 & 1) * auVar23._0_8_;
    auVar24._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * auVar23._16_8_;
    auVar24._24_8_ = (ulong)((byte)(uVar7 >> 3) & 1) * auVar23._24_8_;
    auVar24._32_8_ = (ulong)((byte)(uVar7 >> 4) & 1) * auVar23._32_8_;
    auVar24._40_8_ = (ulong)((byte)(uVar7 >> 5) & 1) * auVar23._40_8_;
    auVar24._48_8_ = (ulong)((byte)(uVar7 >> 6) & 1) * auVar23._48_8_;
    auVar24._56_8_ = (uVar7 >> 7) * auVar23._56_8_;
    auVar26 = vpternlogq_avx512f(auVar24,auVar26,auVar12,0x6c);
    auVar25 = vpgatherqq_avx512f(*(undefined8 *)(unaff_R14 + 0x18));
    auVar23._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * auVar25._8_8_;
    auVar23._0_8_ = (ulong)(bVar5 & 1) * auVar25._0_8_;
    auVar23._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * auVar25._16_8_;
    auVar23._24_8_ = (ulong)((byte)(uVar7 >> 3) & 1) * auVar25._24_8_;
    auVar23._32_8_ = (ulong)((byte)(uVar7 >> 4) & 1) * auVar25._32_8_;
    auVar23._40_8_ = (ulong)((byte)(uVar7 >> 5) & 1) * auVar25._40_8_;
    auVar23._48_8_ = (ulong)((byte)(uVar7 >> 6) & 1) * auVar25._48_8_;
    auVar23._56_8_ = (uVar7 >> 7) * auVar25._56_8_;
    auVar26 = vpternlogq_avx512f(auVar23,auVar26,auVar13,0x6c);
    auVar26 = vpopcntq_avx512_vpopcntdq(auVar26);
    auVar26 = vpandq_avx512f(auVar26,auVar18);
    auVar23 = vpsubq_avx512f(auVar19,auVar14);
    auVar26 = vpsllvq_avx512f(auVar26,auVar23);
    auVar26 = vporq_avx512f(auVar26,auVar21);
    lVar8 = lVar8 + 8;
    auVar14 = vpaddq_avx512f(auVar14,auVar20);
  } while (lVar8 != 0x20);
  auVar10._8_8_ = 0x1e;
  auVar10._0_8_ = 0x1e;
  auVar10._16_8_ = 0x1e;
  auVar10._24_8_ = 0x1e;
  auVar10._32_8_ = 0x1e;
  auVar10._40_8_ = 0x1e;
  auVar10._48_8_ = 0x1e;
  auVar10._56_8_ = 0x1e;
  uVar7 = vpcmpuq_avx512f(auVar22,auVar10,1);
  auVar10 = vmovdqa64_avx512f(auVar26);
  bVar6 = (bool)((byte)uVar7 & 1);
  auVar11._0_8_ = (ulong)bVar6 * auVar10._0_8_ | (ulong)!bVar6 * auVar21._0_8_;
  bVar6 = (bool)((byte)(uVar7 >> 1) & 1);
  auVar11._8_8_ = (ulong)bVar6 * auVar10._8_8_ | (ulong)!bVar6 * auVar21._8_8_;
  bVar6 = (bool)((byte)(uVar7 >> 2) & 1);
  auVar11._16_8_ = (ulong)bVar6 * auVar10._16_8_ | (ulong)!bVar6 * auVar21._16_8_;
  bVar6 = (bool)((byte)(uVar7 >> 3) & 1);
  auVar11._24_8_ = (ulong)bVar6 * auVar10._24_8_ | (ulong)!bVar6 * auVar21._24_8_;
  bVar6 = (bool)((byte)(uVar7 >> 4) & 1);
  auVar11._32_8_ = (ulong)bVar6 * auVar10._32_8_ | (ulong)!bVar6 * auVar21._32_8_;
  bVar6 = (bool)((byte)(uVar7 >> 5) & 1);
  auVar11._40_8_ = (ulong)bVar6 * auVar10._40_8_ | (ulong)!bVar6 * auVar21._40_8_;
  bVar6 = (bool)((byte)(uVar7 >> 6) & 1);
  auVar11._48_8_ = (ulong)bVar6 * auVar10._48_8_ | (ulong)!bVar6 * auVar21._48_8_;
  auVar11._56_8_ = (uVar7 >> 7) * auVar10._56_8_ | (ulong)!SUB81(uVar7 >> 7,0) * auVar21._56_8_;
  auVar9 = vextracti64x4_avx512f(auVar11,1);
  auVar10 = vporq_avx512f(auVar11,ZEXT3264(auVar9));
  auVar1 = vpor_avx(auVar10._0_16_,auVar10._16_16_);
  auVar2 = vpshufd_avx(auVar1,0xee);
  auVar1 = vpor_avx(auVar1,auVar2);
  c->w64[0] = 0;
  c->w64[1] = 0;
  c->w64[2] = 0;
  c->w64[3] = auVar1._0_8_;
  return;
}

Assistant:

void mzd_mul_v_parity_uint64_256_30(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* At) {
  block_t* cblock       = BLOCK(c, 0);
  const block_t* vblock = CONST_BLOCK(v, 0);

  word res = 0;
  for (unsigned int i = 30; i; --i) {
    const block_t* Ablock = CONST_BLOCK(At, 30 - i);
    const word parity =
        parity64_uint64((vblock->w64[0] & Ablock->w64[0]) ^ (vblock->w64[1] & Ablock->w64[1]) ^
                        (vblock->w64[2] & Ablock->w64[2]) ^ (vblock->w64[3] & Ablock->w64[3]));
    res |= parity << (64 - i);
  }
  for (unsigned int j = 0; j < 3; j++) {
    cblock->w64[j] = 0;
  }
  cblock->w64[3] = res;
}